

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rearrangeFunctions.cpp
# Opt level: O2

bool __thiscall GraphNode::isLeaf(GraphNode *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  const_iterator __position;
  iterator iVar2;
  
  for (__position._M_current =
            (this->m_pointers).
            super__Vector_base<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      __position._M_current !=
      (this->m_pointers).
      super__Vector_base<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>.
      _M_impl.super__Vector_impl_data._M_finish; __position._M_current = __position._M_current + 1)
  {
    p_Var1 = ((__position._M_current)->super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if ((p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var1->_M_use_count == 0)) {
      iVar2 = std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>::
              erase(&this->m_pointers,__position);
      __position._M_current = iVar2._M_current + -1;
    }
  }
  return (this->m_pointers).
         super__Vector_base<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>.
         _M_impl.super__Vector_impl_data._M_start == __position._M_current;
}

Assistant:

bool GraphNode::isLeaf() {

    // Remove inactive pointers
    for (auto iter = m_pointers.begin(); iter != m_pointers.end(); iter++)
        if (iter->expired()) {
            iter = m_pointers.erase(iter);
            iter--;
            //std::cout << "deleted a node" << std::endl;
        }

    //std::cout << "ok" << std::endl;
    return m_pointers.empty();
}